

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_t.cpp
# Opt level: O0

void __thiscall deci::stack_t::Print(stack_t *this,ostream *output)

{
  ostream *poVar1;
  void *this_00;
  undefined8 uVar2;
  string local_88 [32];
  int local_68;
  char local_61;
  value_t *local_60;
  value_t *elem;
  size_t i;
  string local_40 [32];
  value_t *local_20;
  size_t depth;
  ostream *output_local;
  stack_t *this_local;
  
  depth = (size_t)output;
  output_local = (ostream *)this;
  local_20 = (value_t *)Depth(this);
  poVar1 = std::operator<<((ostream *)depth,"result: ");
  (*this->result->_vptr_value_t[4])();
  poVar1 = std::operator<<(poVar1,local_40);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_40);
  for (elem = (value_t *)0x0; elem < local_20; elem = (value_t *)((long)&elem->_vptr_value_t + 1)) {
    local_60 = Top(this,(size_t)elem);
    this_00 = (void *)std::ostream::operator<<((void *)depth,std::right);
    uVar2 = std::ostream::operator<<(this_00,std::hex);
    local_61 = (char)std::setfill<char>('0');
    poVar1 = std::operator<<(uVar2,local_61);
    local_68 = (int)std::setw(4);
    poVar1 = std::operator<<(poVar1,(_Setw)local_68);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ulong)elem);
    poVar1 = std::operator<<(poVar1,": ");
    (*local_60->_vptr_value_t[4])();
    poVar1 = std::operator<<(poVar1,local_88);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_88);
  }
  return;
}

Assistant:

void stack_t::Print(std::ostream& output) {
    size_t depth = this->Depth();

    output << "result: " << this->result->ToText() << std::endl;

    for (size_t i = 0; i < depth; ++i) {
      value_t& elem = this->Top(i);
      output << std::right << std::hex << std::setfill('0')
        << std::setw(4) << i << ": "
        << elem.ToText() << std::endl;
    }
  }